

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O3

void __thiscall
ValidationSignals::MempoolTransactionsRemovedForBlock
          (ValidationSignals *this,
          vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
          *txs_removed_for_block,uint nBlockHeight)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  Logger *this_00;
  undefined8 *puVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  pointer in_stack_ffffffffffffff28;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> local_c0;
  uint local_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  undefined8 *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  char *local_name;
  anon_class_40_3_9e0b9ba9_for_event event;
  uint nBlockHeight_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nBlockHeight_local = nBlockHeight;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&event.txs_removed_for_block,txs_removed_for_block);
  local_name = "MempoolTransactionsRemovedForBlock";
  event.nBlockHeight = nBlockHeight;
  event.this = this;
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,VALIDATION,Debug);
  pcVar4 = "MempoolTransactionsRemovedForBlock";
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x60;
    logging_function._M_str = "MempoolTransactionsRemovedForBlock";
    logging_function._M_len = 0x22;
    LogPrintf_<char_const*,unsigned_int,unsigned_long>
              (logging_function,source_file,0xfded2c,(LogFlags)&local_name,
               (Level)&nBlockHeight_local,&stack0xffffffffffffff18,
               (char **)(((long)(txs_removed_for_block->
                                super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(txs_removed_for_block->
                                super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x3333333333333333),
               (uint *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (unsigned_long *)in_stack_ffffffffffffff28);
    pcVar4 = local_name;
    nBlockHeight = nBlockHeight_local;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)&stack0xffffffffffffff28,txs_removed_for_block);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&local_c0,&event.txs_removed_for_block);
  local_a8 = event.nBlockHeight;
  uStack_a4 = event._28_4_;
  uStack_a0 = event.this;
  local_98 = (undefined8 *)0x0;
  uStack_90 = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  puVar3 = (undefined8 *)operator_new(0x50);
  *(uint *)(puVar3 + 1) = nBlockHeight;
  *puVar3 = pcVar4;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)(puVar3 + 2),
             (vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)&stack0xffffffffffffff28);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)(puVar3 + 5),&local_c0);
  *(uint *)(puVar3 + 8) = local_a8;
  *(undefined4 *)((long)puVar3 + 0x44) = uStack_a4;
  *(undefined4 *)(puVar3 + 9) = (undefined4)uStack_a0;
  *(undefined4 *)((long)puVar3 + 0x4c) = uStack_a0._4_4_;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:226:5)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validationinterface.cpp:226:5)>
             ::_M_manager;
  local_98 = puVar3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,3);
  }
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector(&local_c0);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *)
          &stack0xffffffffffffff28);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector(&event.txs_removed_for_block);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::MempoolTransactionsRemovedForBlock(const std::vector<RemovedMempoolTransactionInfo>& txs_removed_for_block, unsigned int nBlockHeight)
{
    auto event = [txs_removed_for_block, nBlockHeight, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.MempoolTransactionsRemovedForBlock(txs_removed_for_block, nBlockHeight); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block height=%s txs removed=%s", __func__,
                          nBlockHeight,
                          txs_removed_for_block.size());
}